

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

void __thiscall icu_63::TZGNCore::initialize(TZGNCore *this,Locale *locale,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  TimeZoneNames *pTVar3;
  char *pcVar4;
  UResourceBundle *pUVar5;
  UChar *pUVar6;
  LocaleDisplayNames *pLVar7;
  UHashtable *pUVar8;
  size_t sVar9;
  UnicodeString *pattern;
  code *pcVar10;
  EVP_PKEY_CTX *ctx;
  ConstChar16Ptr local_1f0;
  UnicodeString local_1e8;
  UChar *local_1a8;
  UChar *tzID;
  TimeZone *tz;
  char loc [157];
  int32_t regionLen;
  char *region;
  UChar *fallbackPattern;
  UChar *regionPattern;
  UResourceBundle *zoneStrings;
  UErrorCode tmpsts;
  undefined1 local_b8 [8];
  UnicodeString fpat;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString rpat;
  UErrorCode *status_local;
  Locale *locale_local;
  TZGNCore *this_local;
  
  rpat.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  pTVar3 = TimeZoneNames::createInstance(locale,(UErrorCode *)rpat.fUnion._48_8_);
  this->fTimeZoneNames = pTVar3;
  UVar1 = ::U_FAILURE(*(UErrorCode *)rpat.fUnion._48_8_);
  if (UVar1 != '\0') {
    return;
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_68,L"{0}");
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_60,'\x01',&local_68,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_68);
  ConstChar16Ptr::ConstChar16Ptr
            ((ConstChar16Ptr *)&stack0xffffffffffffff40,(char16_t *)gDefFallbackPattern);
  icu_63::UnicodeString::UnicodeString
            ((UnicodeString *)local_b8,'\x01',(ConstChar16Ptr *)&stack0xffffffffffffff40,-1);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff40);
  zoneStrings._4_4_ = U_ZERO_ERROR;
  pcVar4 = Locale::getName(locale);
  pUVar5 = ures_open_63("icudt63l-zone",pcVar4,(UErrorCode *)((long)&zoneStrings + 4));
  pUVar5 = ures_getByKeyWithFallback_63
                     (pUVar5,"zoneStrings",pUVar5,(UErrorCode *)((long)&zoneStrings + 4));
  UVar1 = ::U_SUCCESS(zoneStrings._4_4_);
  if (UVar1 != '\0') {
    pUVar6 = ures_getStringByKeyWithFallback_63
                       (pUVar5,"regionFormat",(int32_t *)0x0,(UErrorCode *)((long)&zoneStrings + 4))
    ;
    UVar1 = ::U_SUCCESS(zoneStrings._4_4_);
    if ((UVar1 != '\0') && (iVar2 = u_strlen_63(pUVar6), 0 < iVar2)) {
      icu_63::UnicodeString::setTo((UnicodeString *)local_60,pUVar6,-1);
    }
    zoneStrings._4_4_ = U_ZERO_ERROR;
    pUVar6 = ures_getStringByKeyWithFallback_63
                       (pUVar5,"fallbackFormat",(int32_t *)0x0,
                        (UErrorCode *)((long)&zoneStrings + 4));
    UVar1 = ::U_SUCCESS(zoneStrings._4_4_);
    if ((UVar1 != '\0') && (iVar2 = u_strlen_63(pUVar6), 0 < iVar2)) {
      icu_63::UnicodeString::setTo((UnicodeString *)local_b8,pUVar6,-1);
    }
  }
  ures_close_63(pUVar5);
  SimpleFormatter::applyPatternMinMaxArguments
            (&this->fRegionFormat,(UnicodeString *)local_60,1,1,(UErrorCode *)rpat.fUnion._48_8_);
  pattern = (UnicodeString *)local_b8;
  SimpleFormatter::applyPatternMinMaxArguments
            (&this->fFallbackFormat,pattern,2,2,(UErrorCode *)rpat.fUnion._48_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)rpat.fUnion._48_8_);
  if (UVar1 == '\0') {
    pLVar7 = LocaleDisplayNames::createInstance(locale);
    this->fLocaleDisplayNames = pLVar7;
    pcVar10 = uhash_compareUChars_63;
    pUVar8 = uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,
                           (UErrorCode *)rpat.fUnion._48_8_);
    this->fLocationNamesMap = pUVar8;
    UVar1 = ::U_FAILURE(*(UErrorCode *)rpat.fUnion._48_8_);
    if (UVar1 == '\0') {
      pcVar10 = comparePartialLocationKey;
      pUVar8 = uhash_open_63(hashPartialLocationKey,comparePartialLocationKey,(undefined1 *)0x0,
                             (UErrorCode *)rpat.fUnion._48_8_);
      this->fPartialLocationNamesMap = pUVar8;
      UVar1 = ::U_FAILURE(*(UErrorCode *)rpat.fUnion._48_8_);
      if (UVar1 == '\0') {
        uhash_setKeyDeleter_63(this->fPartialLocationNamesMap,uprv_free_63);
        pcVar4 = Locale::getCountry(&this->fLocale);
        sVar9 = strlen(pcVar4);
        register0x00000000 = (int32_t)sVar9;
        if (register0x00000000 == 0) {
          pcVar4 = Locale::getName(&this->fLocale);
          uloc_addLikelySubtags_63(pcVar4,(char *)&tz,0x9d,(UErrorCode *)rpat.fUnion._48_8_);
          ctx = (EVP_PKEY_CTX *)this->fTargetRegion;
          register0x00000000 =
               uloc_getCountry_63((char *)&tz,(char *)ctx,4,(UErrorCode *)rpat.fUnion._48_8_);
          UVar1 = ::U_SUCCESS(*(UErrorCode *)rpat.fUnion._48_8_);
          if (UVar1 == '\0') {
            cleanup(this,ctx);
            goto LAB_002f42fe;
          }
          this->fTargetRegion[stack0xffffffffffffff0c] = '\0';
        }
        else if (register0x00000000 < 4) {
          strcpy(this->fTargetRegion,pcVar4);
        }
        else {
          this->fTargetRegion[0] = '\0';
        }
        tzID = (UChar *)TimeZone::createDefault();
        local_1a8 = ZoneMeta::getCanonicalCLDRID((TimeZone *)tzID);
        if (local_1a8 != (UChar *)0x0) {
          ConstChar16Ptr::ConstChar16Ptr(&local_1f0,local_1a8);
          icu_63::UnicodeString::UnicodeString(&local_1e8,'\x01',&local_1f0,-1);
          loadStrings(this,&local_1e8);
          icu_63::UnicodeString::~UnicodeString(&local_1e8);
          ConstChar16Ptr::~ConstChar16Ptr(&local_1f0);
        }
        if (tzID != (UChar *)0x0) {
          (**(code **)(*(long *)tzID + 8))();
        }
      }
      else {
        cleanup(this,(EVP_PKEY_CTX *)pcVar10);
      }
    }
    else {
      cleanup(this,(EVP_PKEY_CTX *)pcVar10);
    }
  }
  else {
    cleanup(this,(EVP_PKEY_CTX *)pattern);
  }
LAB_002f42fe:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_b8);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

void
TZGNCore::initialize(const Locale& locale, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }

    // TimeZoneNames
    fTimeZoneNames = TimeZoneNames::createInstance(locale, status);
    if (U_FAILURE(status)) {
        return;
    }

    // Initialize format patterns
    UnicodeString rpat(TRUE, gDefRegionPattern, -1);
    UnicodeString fpat(TRUE, gDefFallbackPattern, -1);

    UErrorCode tmpsts = U_ZERO_ERROR;   // OK with fallback warning..
    UResourceBundle *zoneStrings = ures_open(U_ICUDATA_ZONE, locale.getName(), &tmpsts);
    zoneStrings = ures_getByKeyWithFallback(zoneStrings, gZoneStrings, zoneStrings, &tmpsts);

    if (U_SUCCESS(tmpsts)) {
        const UChar *regionPattern = ures_getStringByKeyWithFallback(zoneStrings, gRegionFormatTag, NULL, &tmpsts);
        if (U_SUCCESS(tmpsts) && u_strlen(regionPattern) > 0) {
            rpat.setTo(regionPattern, -1);
        }
        tmpsts = U_ZERO_ERROR;
        const UChar *fallbackPattern = ures_getStringByKeyWithFallback(zoneStrings, gFallbackFormatTag, NULL, &tmpsts);
        if (U_SUCCESS(tmpsts) && u_strlen(fallbackPattern) > 0) {
            fpat.setTo(fallbackPattern, -1);
        }
    }
    ures_close(zoneStrings);

    fRegionFormat.applyPatternMinMaxArguments(rpat, 1, 1, status);
    fFallbackFormat.applyPatternMinMaxArguments(fpat, 2, 2, status);
    if (U_FAILURE(status)) {
        cleanup();
        return;
    }

    // locale display names
    fLocaleDisplayNames = LocaleDisplayNames::createInstance(locale);

    // hash table for names - no key/value deleters
    fLocationNamesMap = uhash_open(uhash_hashUChars, uhash_compareUChars, NULL, &status);
    if (U_FAILURE(status)) {
        cleanup();
        return;
    }

    fPartialLocationNamesMap = uhash_open(hashPartialLocationKey, comparePartialLocationKey, NULL, &status);
    if (U_FAILURE(status)) {
        cleanup();
        return;
    }
    uhash_setKeyDeleter(fPartialLocationNamesMap, uprv_free);
    // no value deleter

    // target region
    const char* region = fLocale.getCountry();
    int32_t regionLen = static_cast<int32_t>(uprv_strlen(region));
    if (regionLen == 0) {
        char loc[ULOC_FULLNAME_CAPACITY];
        uloc_addLikelySubtags(fLocale.getName(), loc, sizeof(loc), &status);

        regionLen = uloc_getCountry(loc, fTargetRegion, sizeof(fTargetRegion), &status);
        if (U_SUCCESS(status)) {
            fTargetRegion[regionLen] = 0;
        } else {
            cleanup();
            return;
        }
    } else if (regionLen < (int32_t)sizeof(fTargetRegion)) {
        uprv_strcpy(fTargetRegion, region);
    } else {
        fTargetRegion[0] = 0;
    }

    // preload generic names for the default zone
    TimeZone *tz = TimeZone::createDefault();
    const UChar *tzID = ZoneMeta::getCanonicalCLDRID(*tz);
    if (tzID != NULL) {
        loadStrings(UnicodeString(TRUE, tzID, -1));
    }
    delete tz;
}